

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history_buffer.c
# Opt level: O3

history_buffer *
history_buffer_create
          (uint min_traceback_length,uint traceback_group_length,uint renormalize_interval,
          uint num_states,shift_register_t highbit)

{
  history_buffer *phVar1;
  uint8_t **ppuVar2;
  uint8_t *puVar3;
  ulong uVar4;
  uint uVar5;
  ulong __size;
  
  phVar1 = (history_buffer *)calloc(1,0x38);
  phVar1->min_traceback_length = min_traceback_length;
  phVar1->traceback_group_length = traceback_group_length;
  uVar5 = traceback_group_length + min_traceback_length;
  __size = (ulong)uVar5;
  phVar1->cap = uVar5;
  phVar1->num_states = num_states;
  phVar1->highbit = highbit;
  ppuVar2 = (uint8_t **)malloc(__size * 8);
  phVar1->history = ppuVar2;
  if (uVar5 != 0) {
    uVar4 = 0;
    do {
      puVar3 = (uint8_t *)calloc((ulong)num_states,1);
      ppuVar2[uVar4] = puVar3;
      uVar4 = uVar4 + 1;
    } while (__size != uVar4);
  }
  puVar3 = (uint8_t *)malloc(__size);
  phVar1->fetched = puVar3;
  phVar1->index = 0;
  phVar1->len = 0;
  phVar1->renormalize_counter = 0;
  phVar1->renormalize_interval = renormalize_interval;
  return phVar1;
}

Assistant:

history_buffer *history_buffer_create(unsigned int min_traceback_length,
                                      unsigned int traceback_group_length,
                                      unsigned int renormalize_interval, unsigned int num_states,
                                      shift_register_t highbit) {
    history_buffer *buf = calloc(1, sizeof(history_buffer));

    *(unsigned int *)&buf->min_traceback_length = min_traceback_length;
    *(unsigned int *)&buf->traceback_group_length = traceback_group_length;
    *(unsigned int *)&buf->cap = min_traceback_length + traceback_group_length;
    *(unsigned int *)&buf->num_states = num_states;
    *(shift_register_t *)&buf->highbit = highbit;

    buf->history = malloc(buf->cap * sizeof(uint8_t *));
    for (unsigned int i = 0; i < buf->cap; i++) {
        buf->history[i] = calloc(num_states, sizeof(uint8_t));
    }
    buf->fetched = malloc(buf->cap * sizeof(uint8_t));

    buf->index = 0;
    buf->len = 0;

    buf->renormalize_counter = 0;
    buf->renormalize_interval = renormalize_interval;

    return buf;
}